

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O2

png_uint_32 png_get_tIME(png_const_structrp png_ptr,png_inforp info_ptr,png_timep *mod_time)

{
  png_uint_32 pVar1;
  
  pVar1 = 0;
  if (((info_ptr != (png_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
      (mod_time != (png_timep *)0x0)) && ((info_ptr->valid & 0x200) != 0)) {
    *mod_time = &info_ptr->mod_time;
    pVar1 = 0x200;
  }
  return pVar1;
}

Assistant:

png_uint_32 PNGAPI
png_get_tIME(png_const_structrp png_ptr, png_inforp info_ptr,
    png_timep *mod_time)
{
   png_debug1(1, "in %s retrieval function", "tIME");

   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_tIME) != 0 && mod_time != NULL)
   {
      *mod_time = &(info_ptr->mod_time);
      return (PNG_INFO_tIME);
   }

   return (0);
}